

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintAttrValue(TidyDocImpl *doc,uint indent,ctmbstr value,uint delim,Bool wrappable,
                    Bool scriptAttr)

{
  TidyPrintImpl *pprint;
  TidyIndent *pTVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint c_00;
  Bool BVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *str;
  bool bVar11;
  uint c;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  pprint = &doc->pprint;
  iVar3 = *(int *)((doc->config).value + 0x5f);
  local_3c = (wrappable == no) + 4;
  if (((value != (ctmbstr)0x0) && (*value == '<')) &&
     ((value[1] == '%' ||
      ((value[1] == '@' || (iVar5 = prvTidytmbstrncmp(value,"<?php",5), iVar5 == 0)))))) {
    local_3c = local_3c | 0x10;
  }
  c_00 = 0x22;
  if (delim != 0) {
    c_00 = delim;
  }
  AddChar(pprint,0x3d);
  if ((*(int *)((doc->config).value + 100) == 0) || (*(int *)((doc->config).value + 0x62) != 0)) {
    uVar9 = (doc->pprint).linelen;
    if ((ulong)(indent + uVar9) < (doc->config).value[0x5d].v) {
      if ((doc->pprint).indent[0].spaces < 0) {
        (doc->pprint).indent[0].spaces = indent;
      }
      (doc->pprint).wraphere = uVar9;
    }
    else if ((doc->pprint).ixInd == 0) {
      (doc->pprint).indent[1].spaces = indent;
      (doc->pprint).ixInd = 1;
    }
    CheckWrapIndent(doc,indent);
  }
  AddChar(pprint,c_00);
  if (value != (ctmbstr)0x0) {
    local_38 = *(uint *)((doc->config).value + 0x5d);
    pTVar1 = (doc->pprint).indent;
    uVar4 = (doc->pprint).ixInd;
    local_34 = (doc->pprint).linelen;
    (doc->pprint).indent[uVar4].attrValStart = local_34;
    (doc->pprint).indent[uVar4].attrStringStart = -1;
    if (*value != '\0') {
      uVar9 = 0xffffffff;
      do {
        local_40 = (uint)*value;
        if ((wrappable != no) && (*value == ' ')) {
          uVar7 = (doc->pprint).linelen;
          if ((ulong)(indent + uVar7) < (doc->config).value[0x5d].v) {
            if (pTVar1->spaces < 0) {
              pTVar1->spaces = indent;
            }
            (doc->pprint).wraphere = uVar7;
          }
          else if ((doc->pprint).ixInd == 0) {
            (doc->pprint).indent[1].spaces = indent;
            (doc->pprint).ixInd = 1;
            uVar7 = (doc->pprint).wraphere;
            iVar5 = (doc->pprint).indent[0].attrStringStart;
            iVar8 = iVar5 - uVar7;
            if (iVar8 != 0 && (int)uVar7 <= iVar5) {
              (doc->pprint).indent[1].attrStringStart = iVar8;
              (doc->pprint).indent[0].attrStringStart = -1;
            }
            iVar5 = (doc->pprint).indent[0].attrValStart;
            iVar8 = iVar5 - uVar7;
            if (iVar8 != 0 && (int)uVar7 <= iVar5) {
              (doc->pprint).indent[1].attrValStart = iVar8;
              (doc->pprint).indent[0].attrValStart = -1;
            }
          }
          uVar4 = (doc->pprint).ixInd;
          (doc->pprint).indent[uVar4].attrValStart = local_34;
          (doc->pprint).indent[uVar4].attrStringStart = uVar9;
        }
        if ((wrappable != no) && ((doc->pprint).wraphere != 0)) {
          iVar5 = (doc->pprint).indent[0].spaces;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (local_38 <= iVar5 + (doc->pprint).linelen) {
            BVar6 = WantIndent(doc);
            if (BVar6 != no) {
              WriteIndentChar(doc);
            }
            if ((doc->pprint).wraphere != 0) {
              uVar10 = 0;
              do {
                prvTidyWriteChar((doc->pprint).linebuf[uVar10],doc->docOut);
                uVar10 = uVar10 + 1;
              } while (uVar10 < (doc->pprint).wraphere);
            }
            iVar5 = (doc->pprint).indent[0].attrStringStart;
            if (iVar5 == 0) {
              uVar7 = 0x5c;
            }
            else {
              uVar7 = 0x5c;
              if ((int)(doc->pprint).wraphere <= iVar5) {
                uVar7 = 0x20;
              }
              if (iVar5 < 1) {
                uVar7 = 0x20;
              }
            }
            prvTidyWriteChar(uVar7,doc->docOut);
            prvTidyWriteChar(10,doc->docOut);
            puVar2 = &(doc->pprint).line;
            *puVar2 = *puVar2 + 1;
            ResetLineAfterWrap(pprint);
          }
        }
        if (local_40 == c_00) {
          str = "&#39;";
          if (local_40 == 0x22) {
            str = "&quot;";
          }
          AddString(pprint,str);
        }
        else {
          if (local_40 == 0x27) {
            bVar11 = c_00 == 0x22;
            if (*(int *)((doc->config).value + 0x46) == 0) {
              AddChar(pprint,0x27);
            }
            else {
              AddString(pprint,"&#39;");
            }
          }
          else {
            if (local_40 != 0x22) {
              if (0x7f < local_40) {
                uVar7 = prvTidyGetUTF8(value,&local_40);
                value = value + uVar7;
              }
              if (local_40 == 10) {
                uVar7 = 0;
                if (((int)uVar9 < 0) && (uVar7 = 0, *(int *)((doc->config).value + 0x2c) == 0)) {
                  uVar7 = indent;
                }
                prvTidyPFlushLine(doc,uVar7);
              }
              else {
                PPrintChar(doc,local_40,local_3c);
              }
              goto LAB_0014fb82;
            }
            bVar11 = c_00 == 0x27;
            if (*(int *)((doc->config).value + 0x46) == 0) {
              AddChar(pprint,0x22);
            }
            else {
              AddString(pprint,"&quot;");
            }
          }
          if (bVar11 && (iVar3 != 0 && scriptAttr != no)) {
            uVar4 = (doc->pprint).ixInd;
            uVar9 = 0xffffffff;
            if ((doc->pprint).indent[uVar4].attrStringStart < 0) {
              uVar9 = (doc->pprint).linelen;
            }
            pTVar1[uVar4].attrStringStart = uVar9;
          }
        }
LAB_0014fb82:
        value = value + 1;
      } while (*value != '\0');
    }
    pTVar1 = (doc->pprint).indent + (doc->pprint).ixInd;
    pTVar1->attrValStart = -1;
    pTVar1->attrStringStart = -1;
  }
  AddChar(pprint,c_00);
  return;
}

Assistant:

static void PPrintAttrValue( TidyDocImpl* doc, uint indent,
                             ctmbstr value, uint delim, Bool wrappable, Bool scriptAttr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool scriptlets = cfgBool(doc, TidyWrapScriptlets);

    uint mode = PREFORMATTED | ATTRIBVALUE;
    if ( wrappable )
        mode = NORMAL | ATTRIBVALUE;

    /* look for ASP, Tango or PHP instructions for computed attribute value */
    if ( value && value[0] == '<' )
    {
        if ( value[1] == '%' || value[1] == '@'||
             TY_(tmbstrncmp)(value, "<?php", 5) == 0 )
            mode |= CDATA;
    }

    if ( delim == 0 )
        delim = '"';

    AddChar( pprint, '=' );

    /* don't wrap after "=" for xml documents */
    if ( !cfgBool(doc, TidyXmlOut) || cfgBool(doc, TidyXhtmlOut) )
    {
        SetWrap( doc, indent );
        CheckWrapIndent( doc, indent );
        /*
        if ( !SetWrap(doc, indent) )
            PCondFlushLine( doc, indent );
        */
    }

    AddChar( pprint, delim );

    if ( value )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        int attrStart = SetInAttrVal( pprint );
        int strStart = ClearInString( pprint );

        while (*value != '\0')
        {
            uint c = *value;

            if ( wrappable && c == ' ' )
                SetWrapAttr( doc, indent, attrStart, strStart );

            if ( wrappable && pprint->wraphere > 0 &&
                 GetSpaces(pprint) + pprint->linelen >= wraplen )
                WrapAttrVal( doc );

            if ( c == delim )
            {
                ctmbstr entity = (c == '"' ? "&quot;" : "&#39;");
                AddString( pprint, entity );
                ++value;
                continue;
            }
            else if (c == '"')
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&quot;" );
                else
                    AddChar( pprint, c );

                if ( delim == '\'' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }
            else if ( c == '\'' )
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&#39;" );
                else
                    AddChar( pprint, c );

                if ( delim == '"' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }

            /* look for UTF-8 multibyte character */
            if ( c > 0x7F )
                 value += TY_(GetUTF8)( value, &c );
            ++value;

            if ( c == '\n' )
            {
                /* No indent inside Javascript literals */
                TY_(PFlushLine)( doc, (strStart < 0
                                       && !cfgBool(doc, TidyLiteralAttribs) ?
                                       indent : 0) );
                continue;
            }
            PPrintChar( doc, c, mode );
        }
        ClearInAttrVal( pprint );
        ClearInString( pprint );
    }
    AddChar( pprint, delim );
}